

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# put_data.cpp
# Opt level: O2

void __thiscall libtorrent::dht::put_data::done(put_data *this)

{
  uint uVar1;
  dht_observer *pdVar2;
  int iVar3;
  undefined4 extraout_var;
  
  this->m_done = true;
  pdVar2 = ((this->super_traversal_algorithm).m_node)->m_observer;
  uVar1 = (this->super_traversal_algorithm).m_id;
  iVar3 = (*(this->super_traversal_algorithm)._vptr_traversal_algorithm[2])();
  (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])
            (pdVar2,4,"[%u] %s DONE, response %d, timeout %d",(ulong)uVar1,
             CONCAT44(extraout_var,iVar3),
             (ulong)(uint)(int)(this->super_traversal_algorithm).m_responses,
             (int)(this->super_traversal_algorithm).m_timeouts);
  ::std::function<void_(const_libtorrent::dht::item_&,_int)>::operator()
            (&this->m_put_callback,&this->m_data,(int)(this->super_traversal_algorithm).m_responses)
  ;
  traversal_algorithm::done(&this->super_traversal_algorithm);
  return;
}

Assistant:

void put_data::done()
{
	m_done = true;

#ifndef TORRENT_DISABLE_LOGGING
	get_node().observer()->log(dht_logger::traversal, "[%u] %s DONE, response %d, timeout %d"
		, id(), name(), num_responses(), num_timeouts());
#endif

	m_put_callback(m_data, num_responses());
	traversal_algorithm::done();
}